

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x64.c
# Opt level: O0

void asm_load_stack(MCodeChunk *chunk,Trace *trace,IrIns ins)

{
  uint16_t uVar1;
  uint32_t uVar2;
  uint32_t stack_slot;
  uint16_t dest_reg;
  IrIns ins_local;
  Trace *trace_local;
  MCodeChunk *chunk_local;
  
  uVar1 = ir_reg(ins);
  uVar2 = ir_arg32(ins);
  if (uVar2 == 0) {
    printf("movsd xmm%d, [rdx]\n",(ulong)uVar1);
  }
  else {
    printf("movsd xmm%d, [rdx + 0x%x]\n",(ulong)uVar1,(ulong)(uVar2 << 3));
  }
  return;
}

Assistant:

static void asm_load_stack(MCodeChunk *chunk, Trace *trace, IrIns ins) {
	// movsd xmm<reg>, [<stack> + <offset> * 8]
	uint16_t dest_reg = ir_reg(ins);
	uint32_t stack_slot = ir_arg32(ins);
#ifdef ASM_DEBUG
	if (stack_slot == 0) {
		printf("movsd xmm%d, [rdx]\n", dest_reg);
	} else {
		printf("movsd xmm%d, [rdx + 0x%x]\n", dest_reg, stack_slot * 8);
	}
#endif

	// TODO: instruction encoding
}